

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

bool __thiscall
bssl::Vector<bssl::CertCompressionAlg>::MaybeGrow(Vector<bssl::CertCompressionAlg> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_t sVar4;
  undefined8 uVar5;
  CertCompressionAlg *pCVar6;
  long lVar7;
  bool bVar8;
  CertCompressionAlg *orig_ptr;
  int line;
  size_t sVar9;
  
  uVar3 = this->capacity_;
  bVar8 = true;
  if (this->size_ < uVar3) {
    return true;
  }
  if (uVar3 == 0) {
    sVar9 = 0x10;
LAB_00158fda:
    pCVar6 = (CertCompressionAlg *)OPENSSL_malloc(sVar9 * 0x18);
    if (pCVar6 == (CertCompressionAlg *)0x0) {
      bVar8 = false;
    }
    else {
      orig_ptr = this->data_;
      sVar4 = this->size_;
      if (sVar4 != 0) {
        lVar7 = 0;
        do {
          *(undefined8 *)((long)&pCVar6->alg_id + lVar7) =
               *(undefined8 *)((long)&orig_ptr->alg_id + lVar7);
          puVar1 = (undefined8 *)((long)&orig_ptr->compress + lVar7);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pCVar6->compress + lVar7);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar7 = lVar7 + 0x18;
        } while (sVar4 * 0x18 != lVar7);
        orig_ptr = this->data_;
      }
      OPENSSL_free(orig_ptr);
      this->data_ = pCVar6;
      this->size_ = sVar4;
      this->capacity_ = sVar9;
    }
  }
  else {
    if ((long)uVar3 < 0) {
      line = 0x14d;
    }
    else {
      if (uVar3 < 0x555555555555556) {
        sVar9 = uVar3 * 2;
        goto LAB_00158fda;
      }
      line = 0x153;
    }
    bVar8 = false;
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/../crypto/mem_internal.h"
                  ,line);
  }
  return bVar8;
}

Assistant:

bool MaybeGrow() {
    // No need to grow if we have room for one more T.
    if (size_ < capacity_) {
      return true;
    }
    size_t new_capacity = kDefaultSize;
    if (capacity_ > 0) {
      // Double the array's size if it's safe to do so.
      if (capacity_ > SIZE_MAX / 2) {
        OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
        return false;
      }
      new_capacity = capacity_ * 2;
    }
    if (new_capacity > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    T *new_data =
        reinterpret_cast<T *>(OPENSSL_malloc(new_capacity * sizeof(T)));
    if (new_data == nullptr) {
      return false;
    }
    size_t new_size = size_;
    std::uninitialized_move(begin(), end(), new_data);
    clear();
    data_ = new_data;
    size_ = new_size;
    capacity_ = new_capacity;
    return true;
  }